

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
dgrminer::find_minimum_labelings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges,
          bool ignore_starting_edges)

{
  pointer paVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  iterator __position_00;
  pointer paVar4;
  undefined7 in_register_00000009;
  pointer paVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  array<int,_10UL> min_edge;
  int local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,ignore_starting_edges);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar5 = (pattern_edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((pattern_edge_list->
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != paVar5) {
    lVar11 = 8;
    lVar10 = 0;
    uVar6 = 0;
    do {
      if ((char)local_5c == '\0') {
        paVar4 = (starting_edges->
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)(starting_edges->
                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4;
        if (lVar7 != 0) {
          lVar7 = lVar7 >> 5;
          lVar8 = 0;
          do {
            lVar9 = 0;
            while (*(int *)((long)paVar5->_M_elems + lVar9 * 4 + lVar11) == paVar4->_M_elems[lVar9])
            {
              lVar9 = lVar9 + 1;
              if (lVar9 == 7) goto LAB_00153991;
            }
            lVar8 = lVar8 + 1;
            paVar4 = paVar4 + 1;
          } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
        }
      }
      else {
LAB_00153991:
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        __position_00._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60 = (int)uVar6;
        if (__position_00._M_current == __position._M_current) {
          if (__position_00._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,__position_00,&local_60);
            paVar5 = (pattern_edge_list->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *__position_00._M_current = local_60;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          local_58 = *(undefined8 *)paVar5[uVar6]._M_elems;
          uStack_50 = *(undefined8 *)(paVar5[uVar6]._M_elems + 2);
          local_48 = *(undefined8 *)(paVar5[uVar6]._M_elems + 4);
          uStack_40 = *(undefined8 *)(paVar5[uVar6]._M_elems + 4 + 2);
          local_38 = *(undefined8 *)(paVar5[uVar6]._M_elems + 8);
        }
        else {
          paVar1 = paVar5 + uVar6;
          lVar7 = 2;
          do {
            iVar2 = *(int *)((long)&local_58 + lVar7 * 4);
            iVar3 = *(int *)((long)paVar5->_M_elems + lVar7 * 4 + lVar10);
            if (iVar3 < iVar2) {
              local_38 = *(undefined8 *)(paVar1->_M_elems + 8);
              local_58 = *(undefined8 *)paVar1->_M_elems;
              local_48 = *(undefined8 *)(paVar1->_M_elems + 4);
              uStack_40 = *(undefined8 *)(paVar1->_M_elems + 6);
              uStack_50 = *(undefined8 *)(paVar1->_M_elems + 2);
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current;
              if (__position._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (__return_storage_ptr__,__position,&local_60);
              }
              else {
                *__position._M_current = local_60;
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              goto LAB_00153ac3;
            }
            if (iVar2 < iVar3) goto LAB_00153ac3;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 9);
          if (__position_00._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,__position_00,&local_60);
          }
          else {
            *__position_00._M_current = local_60;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
      }
LAB_00153ac3:
      uVar6 = uVar6 + 1;
      paVar5 = (pattern_edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x28;
      lVar10 = lVar10 + 0x28;
    } while (uVar6 < (ulong)(((long)(pattern_edge_list->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3)
                            * -0x3333333333333333));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> find_minimum_labelings(std::vector<std::array<int, 10>> &pattern_edge_list,
                                            std::vector<std::array<int, 8>> &starting_edges,
                                            bool ignore_starting_edges)
    {
        std::array<int, 10> min_edge;
        std::vector<int> min_ind; // can contain several indices, if there are several same edges (probably not necessary to have vector, because it may be impossible to have several of them when using edge IDs)
        for (size_t i = 0; i < pattern_edge_list.size(); i++)
        {
            // check if the i-th edge is in the starting_edges list:
            bool is_in_starting = false;

            if (ignore_starting_edges)
            {
                is_in_starting = true;
            }
            else
            {
                for (size_t j = 0; j < starting_edges.size(); j++)
                {
                    bool is_same = true;

                    // use only the first 7 elements (DO NOT USE edge id)
                    for (int k = 0; k < 7; k++)
                    {
                        if (pattern_edge_list[i][k + 2] != starting_edges[j][k])
                        {
                            is_same = false;
                            break;
                        }
                    }
                    if (is_same)
                    {
                        is_in_starting = true;
                        break;
                    }

                }
            }

            // if it is in the starting_edges list, then
            if (is_in_starting)
            {
                // if it is the first edge, add it
                if (min_ind.size() == 0)
                {
                    min_ind.push_back(i);
                    min_edge = pattern_edge_list[i];
                }
                    // if it is not the first one, check if it is smaller
                else
                {
                    // check also whether it is same as the smallest one
                    bool is_same_as_min = true;
                    // // check also edge ID (10th element)
                    // do not check ID
                    for (int k = 2; k < 9; k++)
                    {
                        if (pattern_edge_list[i][k] < min_edge[k])
                        {
                            min_edge = pattern_edge_list[i];
                            min_ind.clear();
                            min_ind.push_back(i);
                            is_same_as_min = false;
                            break;
                        }
                        else if (pattern_edge_list[i][k] > min_edge[k])
                        {
                            is_same_as_min = false;
                            break;
                        }
                    }
                    if (is_same_as_min)
                    {
                        min_ind.push_back(i);
                    }
                }
            }


        }

        return min_ind;

    }